

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Printer::RegisterFieldValuePrinter
          (Printer *this,FieldDescriptor *field,FieldValuePrinter *printer)

{
  map<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
  *this_00;
  _Rb_tree_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>
  __u;
  undefined1 uVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<const_FieldDescriptor_*,_std::nullptr_t>_>::value,_pair<iterator,_bool>_>
  _Var2;
  __enable_if_t<is_constructible<value_type,_pair<const_FieldDescriptor_*,_std::nullptr_t>_>::value,_pair<iterator,_bool>_>
  pair;
  unique_ptr<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper,_std::default_delete<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper>_>
  wrapper;
  FieldValuePrinter *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  pair<const_google::protobuf::FieldDescriptor_*,_std::nullptr_t> *in_stack_ffffffffffffff68;
  bool local_1;
  
  if ((in_RSI == 0) || (in_RDX == 0)) {
    local_1 = false;
  }
  else {
    operator_new(0x10);
    anon_unknown_19::FieldValuePrinterWrapper::FieldValuePrinterWrapper
              ((FieldValuePrinterWrapper *)
               CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    std::
    unique_ptr<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper,std::default_delete<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper>>
    ::
    unique_ptr<std::default_delete<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper>,void>
              ((unique_ptr<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper,_std::default_delete<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper>_>
                *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               (pointer)in_stack_ffffffffffffff58);
    this_00 = (map<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
               *)(in_RDI + 0x20);
    std::make_pair<google::protobuf::FieldDescriptor_const*&,decltype(nullptr)>
              ((FieldDescriptor **)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               &in_stack_ffffffffffffff58->_vptr_FieldValuePrinter);
    _Var2 = std::
            map<google::protobuf::FieldDescriptor_const*,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
            ::insert<std::pair<google::protobuf::FieldDescriptor_const*,decltype(nullptr)>>
                      (this_00,in_stack_ffffffffffffff68);
    __u = _Var2.first._M_node;
    uVar1 = _Var2.second;
    local_1 = ((undefined1  [16])_Var2 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
    if (local_1) {
      std::
      unique_ptr<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper,_std::default_delete<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper>_>
      ::operator->((unique_ptr<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper,_std::default_delete<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper>_>
                    *)0x44eb27);
      anon_unknown_19::FieldValuePrinterWrapper::SetDelegate
                ((FieldValuePrinterWrapper *)CONCAT17(uVar1,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      std::
      _Rb_tree_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>
                    *)0x44eb43);
      std::
      unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>
      ::operator=((unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                   *)this_00,
                  (unique_ptr<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper,_std::default_delete<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper>_>
                   *)__u._M_node);
    }
    std::
    unique_ptr<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper,_std::default_delete<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper>_>
    ::~unique_ptr((unique_ptr<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper,_std::default_delete<google::protobuf::(anonymous_namespace)::FieldValuePrinterWrapper>_>
                   *)CONCAT17(uVar1,in_stack_ffffffffffffff60));
  }
  return local_1;
}

Assistant:

bool TextFormat::Printer::RegisterFieldValuePrinter(
    const FieldDescriptor* field, const FieldValuePrinter* printer) {
  if (field == nullptr || printer == nullptr) {
    return false;
  }
  std::unique_ptr<FieldValuePrinterWrapper> wrapper(
      new FieldValuePrinterWrapper(nullptr));
  auto pair = custom_printers_.insert(std::make_pair(field, nullptr));
  if (pair.second) {
    wrapper->SetDelegate(printer);
    pair.first->second = std::move(wrapper);
    return true;
  } else {
    return false;
  }
}